

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createDynamicAlloc
          (LLVMPointerGraphBuilder *this,CallInst *CInst,AllocationFunction type)

{
  PSNodeAlloc *this_00;
  uint64_t uVar1;
  int in_EDX;
  PSNodeAlloc *node;
  uint64_t size2;
  uint64_t size;
  Value *op;
  Value *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar2;
  raw_ostream *this_01;
  size_t local_28;
  
  this_01 = (raw_ostream *)0x0;
  PointerGraph::create<(dg::pta::PSNodeType)1>
            ((PointerGraph *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  this_00 = PSNodeAlloc::get<dg::pta::PSNode>
                      ((PSNode *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  PSNodeAlloc::setIsHeap(this_00);
  iVar2 = in_EDX;
  if (in_EDX == 1) {
    PSNodeAlloc::setIsHeap(this_00);
  }
  else {
    if (in_EDX == 2) {
      PSNodeAlloc::setIsHeap(this_00);
      PSNodeAlloc::setZeroInitialized(this_00);
      llvm::CallBase::getOperand
                ((CallBase *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                 (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      goto LAB_001bb587;
    }
    if (in_EDX != 3) {
      llvm::errs();
      llvm::operator<<((raw_ostream *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
      llvm::raw_ostream::operator<<(this_01,(char *)this_00);
      abort();
    }
  }
  llvm::CallBase::getOperand
            ((CallBase *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
             (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
LAB_001bb587:
  local_28 = llvmutils::getConstantSizeValue(in_stack_ffffffffffffffb8);
  if ((local_28 != 0) && (in_EDX == 2)) {
    llvm::CallBase::getOperand
              ((CallBase *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
               (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    uVar1 = llvmutils::getConstantSizeValue(in_stack_ffffffffffffffb8);
    if (uVar1 == 0) {
      local_28 = 0;
    }
    else {
      local_28 = local_28 * uVar1;
    }
  }
  SubgraphNode<dg::pta::PSNode>::setSize
            (&(this_00->super_PSNode).super_SubgraphNode<dg::pta::PSNode>,local_28);
  return &this_00->super_PSNode;
}

Assistant:

PSNode *LLVMPointerGraphBuilder::createDynamicAlloc(const llvm::CallInst *CInst,
                                                    AllocationFunction type) {
    using namespace llvm;

    const Value *op;
    uint64_t size = 0, size2 = 0;
    PSNodeAlloc *node = PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>());
    node->setIsHeap();

    switch (type) {
    case AllocationFunction::MALLOC:
        node->setIsHeap();
        /* fallthrough */
    case AllocationFunction::ALLOCA:
        op = CInst->getOperand(0);
        break;
    case AllocationFunction::CALLOC:
        node->setIsHeap();
        node->setZeroInitialized();
        op = CInst->getOperand(1);
        break;
    default:
        errs() << *CInst << "\n";
        assert(0 && "unknown memory allocation type");
        // for NDEBUG
        abort();
    };

    // infer allocated size
    size = llvmutils::getConstantSizeValue(op);
    if (size != 0 && type == AllocationFunction::CALLOC) {
        // if this is call to calloc, the size is given
        // in the first argument too
        size2 = llvmutils::getConstantSizeValue(CInst->getOperand(0));
        // if both ops are constants, multiply them to get
        // the correct size, otherwise return 0 (unknown)
        size = size2 != 0 ? size * size2 : 0;
    }

    node->setSize(size);
    return node;
}